

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# getinfo.c
# Opt level: O0

CURLcode getinfo_offt(Curl_easy *data,CURLINFO info,curl_off_t *param_offt)

{
  curl_off_t local_40;
  curl_off_t local_38;
  curl_off_t *param_offt_local;
  CURLINFO info_local;
  Curl_easy *data_local;
  
  switch(info) {
  case CURLINFO_SIZE_UPLOAD_T:
    *param_offt = (data->progress).uploaded;
    break;
  case CURLINFO_SIZE_DOWNLOAD_T:
    *param_offt = (data->progress).downloaded;
    break;
  case CURLINFO_SPEED_DOWNLOAD_T:
    *param_offt = (data->progress).dlspeed;
    break;
  case CURLINFO_SPEED_UPLOAD_T:
    *param_offt = (data->progress).ulspeed;
    break;
  default:
    return CURLE_UNKNOWN_OPTION;
  case CURLINFO_FILETIME_T:
    *param_offt = (data->info).filetime;
    break;
  case CURLINFO_CONTENT_LENGTH_DOWNLOAD_T:
    if (((data->progress).flags & 0x40U) == 0) {
      local_38 = -1;
    }
    else {
      local_38 = (data->progress).size_dl;
    }
    *param_offt = local_38;
    break;
  case CURLINFO_CONTENT_LENGTH_UPLOAD_T:
    if (((data->progress).flags & 0x20U) == 0) {
      local_40 = -1;
    }
    else {
      local_40 = (data->progress).size_ul;
    }
    *param_offt = local_40;
    break;
  case CURLINFO_TOTAL_TIME_T:
    *param_offt = (data->progress).timespent;
    break;
  case CURLINFO_NAMELOOKUP_TIME_T:
    *param_offt = (data->progress).t_nslookup;
    break;
  case CURLINFO_CONNECT_TIME_T:
    *param_offt = (data->progress).t_connect;
    break;
  case CURLINFO_PRETRANSFER_TIME_T:
    *param_offt = (data->progress).t_pretransfer;
    break;
  case CURLINFO_STARTTRANSFER_TIME_T:
    *param_offt = (data->progress).t_starttransfer;
    break;
  case CURLINFO_REDIRECT_TIME_T:
    *param_offt = (data->progress).t_redirect;
    break;
  case CURLINFO_APPCONNECT_TIME_T:
    *param_offt = (data->progress).t_appconnect;
  }
  return CURLE_OK;
}

Assistant:

static CURLcode getinfo_offt(struct Curl_easy *data, CURLINFO info,
                             curl_off_t *param_offt)
{
  switch(info) {
  case CURLINFO_FILETIME_T:
    *param_offt = (curl_off_t)data->info.filetime;
    break;
  case CURLINFO_SIZE_UPLOAD_T:
    *param_offt = data->progress.uploaded;
    break;
  case CURLINFO_SIZE_DOWNLOAD_T:
    *param_offt = data->progress.downloaded;
    break;
  case CURLINFO_SPEED_DOWNLOAD_T:
    *param_offt =  data->progress.dlspeed;
    break;
  case CURLINFO_SPEED_UPLOAD_T:
    *param_offt = data->progress.ulspeed;
    break;
  case CURLINFO_CONTENT_LENGTH_DOWNLOAD_T:
    *param_offt = (data->progress.flags & PGRS_DL_SIZE_KNOWN)?
      data->progress.size_dl:-1;
    break;
  case CURLINFO_CONTENT_LENGTH_UPLOAD_T:
    *param_offt = (data->progress.flags & PGRS_UL_SIZE_KNOWN)?
      data->progress.size_ul:-1;
    break;
  case CURLINFO_TOTAL_TIME_T:
    *param_offt = data->progress.timespent;
    break;
  case CURLINFO_NAMELOOKUP_TIME_T:
    *param_offt = data->progress.t_nslookup;
    break;
  case CURLINFO_CONNECT_TIME_T:
    *param_offt = data->progress.t_connect;
    break;
  case CURLINFO_APPCONNECT_TIME_T:
    *param_offt = data->progress.t_appconnect;
    break;
  case CURLINFO_PRETRANSFER_TIME_T:
    *param_offt = data->progress.t_pretransfer;
    break;
  case CURLINFO_STARTTRANSFER_TIME_T:
    *param_offt = data->progress.t_starttransfer;
    break;
  case CURLINFO_REDIRECT_TIME_T:
    *param_offt = data->progress.t_redirect;
    break;

  default:
    return CURLE_UNKNOWN_OPTION;
  }

  return CURLE_OK;
}